

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Nonlin.c
# Opt level: O2

void Llb_NonlinExperiment(Aig_Man_t *pAig,int Num)

{
  abctime aVar1;
  Aig_Man_t *p;
  Llb_Mnn_t *p_00;
  abctime aVar2;
  Gia_ParLlb_t Pars;
  Gia_ParLlb_t local_90;
  
  aVar1 = Abc_Clock();
  Llb_ManSetDefaultParams(&local_90);
  local_90.fVerbose = 1;
  p = Aig_ManDupFlopsOnly(pAig);
  Aig_ManPrintStats(pAig);
  Aig_ManPrintStats(p);
  p_00 = Llb_MnnStart(pAig,p,&local_90);
  Llb_NonlinReachability(p_00);
  aVar2 = Abc_Clock();
  p_00->timeTotal = aVar2 - aVar1;
  Llb_MnnStop(p_00);
  Aig_ManStop(p);
  return;
}

Assistant:

void Llb_NonlinExperiment( Aig_Man_t * pAig, int Num )
{
    Llb_Mnn_t * pMnn;
    Gia_ParLlb_t Pars, * pPars = &Pars;
    Aig_Man_t * p;
    abctime clk = Abc_Clock();

    Llb_ManSetDefaultParams( pPars );
    pPars->fVerbose = 1;

    p = Aig_ManDupFlopsOnly( pAig );
//Aig_ManShow( p, 0, NULL );
    Aig_ManPrintStats( pAig );
    Aig_ManPrintStats( p );

    pMnn = Llb_MnnStart( pAig, p, pPars );
    Llb_NonlinReachability( pMnn );
    pMnn->timeTotal = Abc_Clock() - clk;
    Llb_MnnStop( pMnn );

    Aig_ManStop( p );
}